

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O2

void lex_longstring(LexState *ls,TValue *tv,int sep)

{
  SBuf *sb;
  LexChar LVar1;
  byte *pbVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  GCstr *pGVar6;
  ErrMsg em;
  
  LVar1 = ls->c;
  sb = &ls->sb;
  pcVar5 = (ls->sb).w;
  if (*(int *)&(ls->sb).e == (int)pcVar5) {
    pcVar5 = lj_buf_more2(sb,1);
  }
  *pcVar5 = (char)LVar1;
  (ls->sb).w = pcVar5 + 1;
  pbVar2 = (byte *)ls->p;
  if (pbVar2 < ls->pe) {
    ls->p = (char *)(pbVar2 + 1);
    uVar4 = (uint)*pbVar2;
  }
  else {
    uVar4 = lex_more(ls);
  }
  ls->c = uVar4;
  if ((uVar4 == 0xd) || (uVar4 == 10)) {
    lex_newline(ls);
  }
  do {
    while( true ) {
      while ((iVar3 = ls->c, iVar3 == 10 || (iVar3 == 0xd))) {
        pcVar5 = (ls->sb).w;
        if (*(int *)&(ls->sb).e == (int)pcVar5) {
          pcVar5 = lj_buf_more2(sb,1);
        }
        *pcVar5 = '\n';
        (ls->sb).w = pcVar5 + 1;
        lex_newline(ls);
        if (tv == (TValue *)0x0) {
          (ls->sb).w = (ls->sb).b;
        }
      }
      if (iVar3 == 0x5d) break;
      if (iVar3 == -1) {
        em = LJ_ERR_XLSTR;
        if (tv == (TValue *)0x0) {
          em = LJ_ERR_XLCOM;
        }
        lj_lex_error(ls,0x121,em);
      }
      pcVar5 = (ls->sb).w;
      if (*(int *)&(ls->sb).e == (int)pcVar5) {
        pcVar5 = lj_buf_more2(sb,1);
      }
      *pcVar5 = (char)iVar3;
      (ls->sb).w = pcVar5 + 1;
      pbVar2 = (byte *)ls->p;
      if (pbVar2 < ls->pe) {
        ls->p = (char *)(pbVar2 + 1);
        uVar4 = (uint)*pbVar2;
      }
      else {
        uVar4 = lex_more(ls);
      }
      ls->c = uVar4;
    }
    iVar3 = lex_skipeq(ls);
  } while (iVar3 != sep);
  LVar1 = ls->c;
  pcVar5 = (ls->sb).w;
  if (*(int *)&(ls->sb).e == (int)pcVar5) {
    pcVar5 = lj_buf_more2(sb,1);
  }
  *pcVar5 = (char)LVar1;
  (ls->sb).w = pcVar5 + 1;
  pbVar2 = (byte *)ls->p;
  if (pbVar2 < ls->pe) {
    ls->p = (char *)(pbVar2 + 1);
    uVar4 = (uint)*pbVar2;
  }
  else {
    uVar4 = lex_more(ls);
  }
  ls->c = uVar4;
  if (tv != (TValue *)0x0) {
    pcVar5 = (ls->sb).b;
    pGVar6 = lj_parse_keepstr(ls,pcVar5 + (ulong)(uint)sep + 2,
                              (ulong)(((*(int *)&(ls->sb).w - (int)pcVar5) + sep * -2) - 4));
    tv->u64 = (ulong)pGVar6 | 0xfffd800000000000;
  }
  return;
}

Assistant:

static void lex_longstring(LexState *ls, TValue *tv, int sep)
{
  lex_savenext(ls);  /* Skip second '['. */
  if (lex_iseol(ls))  /* Skip initial newline. */
    lex_newline(ls);
  for (;;) {
    switch (ls->c) {
    case LEX_EOF:
      lj_lex_error(ls, TK_eof, tv ? LJ_ERR_XLSTR : LJ_ERR_XLCOM);
      break;
    case ']':
      if (lex_skipeq(ls) == sep) {
	lex_savenext(ls);  /* Skip second ']'. */
	goto endloop;
      }
      break;
    case '\n':
    case '\r':
      lex_save(ls, '\n');
      lex_newline(ls);
      if (!tv) lj_buf_reset(&ls->sb);  /* Don't waste space for comments. */
      break;
    default:
      lex_savenext(ls);
      break;
    }
  } endloop:
  if (tv) {
    GCstr *str = lj_parse_keepstr(ls, ls->sb.b + (2 + (MSize)sep),
				      sbuflen(&ls->sb) - 2*(2 + (MSize)sep));
    setstrV(ls->L, tv, str);
  }
}